

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O2

bool __thiscall
helics::NetworkCore<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1>::brokerConnect
          (NetworkCore<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1> *this)

{
  bool bVar1;
  UdpComms *this_00;
  int iVar2;
  string *commName;
  milliseconds timeOut;
  socklen_t __len;
  sockaddr *__addr;
  
  CLI::std::mutex::lock(&this->dataMutex);
  if ((this->netInfo).brokerAddress._M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&(this->netInfo).brokerAddress,"127.0.0.1");
  }
  CommsInterface::setRequireBrokerConnection
            ((CommsInterface *)
             (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t.
             super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
             .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl,true);
  bVar1 = (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).super_CommonCore.
          super_BrokerBase.observer;
  (this->netInfo).useJsonSerialization =
       (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).super_CommonCore.
       super_BrokerBase.useJsonSerialization;
  (this->netInfo).observer = bVar1;
  this_00 = (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t.
            super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
            .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl;
  commName = CommonCore::getIdentifier_abi_cxx11_((CommonCore *)this);
  CommsInterface::setName((CommsInterface *)this_00,commName);
  udp::UdpComms::loadNetworkInfo
            ((this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t.
             super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
             .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl,&this->netInfo);
  __len = 1000000;
  timeOut.__r = (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).
                super_CommonCore.super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
  CommsInterface::setTimeout
            ((CommsInterface *)
             (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t.
             super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
             .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl,timeOut);
  iVar2 = CommsInterface::connect
                    ((CommsInterface *)
                     (this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t
                     .
                     super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
                     .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl,
                     (int)timeOut.__r,__addr,__len);
  if ((SUB41(iVar2,0) != false) && ((this->netInfo).portNumber < 0)) {
    (this->netInfo).portNumber =
         (((this->super_CommsBroker<helics::udp::UdpComms,_helics::CommonCore>).comms._M_t.
           super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
           .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl)->
         super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
  return SUB41(iVar2,0);
}

Assistant:

bool NetworkCore<COMMS, baseline>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if (netInfo.brokerAddress.empty())  // cores require a broker
    {
        netInfo.brokerAddress = defBrokerInterface[static_cast<int>(baseline)];
    }
    CommsBroker<COMMS, CommonCore>::comms->setRequireBrokerConnection(true);
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CommonCore>::comms->setName(CommonCore::getIdentifier());
    CommsBroker<COMMS, CommonCore>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CommonCore>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());
    auto res = CommsBroker<COMMS, CommonCore>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CommonCore>::comms->getPort();
        }
    }
    return res;
}